

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall el::base::LogFormat::operator==(LogFormat *this,LogFormat *other)

{
  __type _Var1;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  bool local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  local_11 = false;
  if ((int)in_RDI->_M_string_length == *(int *)(in_RSI + 8)) {
    __rhs = in_RDI;
    _Var1 = std::operator==(unaff_retaddr,in_RDI);
    local_11 = false;
    if (_Var1) {
      _Var1 = std::operator==(unaff_retaddr,__rhs);
      local_11 = false;
      if (_Var1) {
        _Var1 = std::operator==(unaff_retaddr,__rhs);
        local_11 = false;
        if (_Var1) {
          local_11 = *(int *)&in_RDI[3].field_2 == *(int *)(in_RSI + 0x70);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool LogFormat::operator==(const LogFormat& other) {
  return m_level == other.m_level && m_userFormat == other.m_userFormat && m_format == other.m_format &&
         m_dateTimeFormat == other.m_dateTimeFormat && m_flags == other.m_flags;
}